

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecComputeFlipInvGain(Sfm_Dec_t *p,Abc_Obj_t *pPivot,int *pfNeedInv)

{
  Mio_Gate_t *pGate_00;
  int iVar1;
  int iVar2;
  int iFanin;
  Abc_Obj_t *pObj;
  Mio_Gate_t *pGate_01;
  double dVar3;
  int local_48;
  int local_44;
  int Gain;
  int fNeedInv;
  int Handle;
  int i;
  Mio_Gate_t *pGateNew;
  Mio_Gate_t *pGate;
  Abc_Obj_t *pFanout;
  int *pfNeedInv_local;
  Abc_Obj_t *pPivot_local;
  Sfm_Dec_t *p_local;
  
  local_44 = 0;
  local_48 = 0;
  for (fNeedInv = 0; iVar1 = Abc_ObjFanoutNum(pPivot), fNeedInv < iVar1; fNeedInv = fNeedInv + 1) {
    pObj = Abc_ObjFanout(pPivot,fNeedInv);
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) {
      local_44 = 1;
    }
    else {
      pGate_00 = (Mio_Gate_t *)(pObj->field_5).pData;
      iVar1 = Abc_ObjFaninNum(pObj);
      if ((iVar1 == 1) && (iVar1 = Mio_GateIsInv(pGate_00), iVar1 != 0)) {
        local_48 = p->AreaInv + local_48;
      }
      else {
        iVar1 = Mio_GateReadValue(pGate_00);
        iVar2 = Abc_ObjFaninNum(pObj);
        iFanin = Abc_NodeFindFanin(pObj,pPivot);
        iVar1 = Sfm_LibFindComplInputGate(&p->vGateFuncs,iVar1,iVar2,iFanin,(int *)0x0);
        if (iVar1 == -1) {
          local_44 = 1;
        }
        else {
          pGate_01 = (Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands,iVar1);
          dVar3 = Mio_GateReadArea(pGate_00);
          iVar1 = Scl_Flt2Int((float)dVar3);
          dVar3 = Mio_GateReadArea(pGate_01);
          iVar2 = Scl_Flt2Int((float)dVar3);
          local_48 = (iVar1 - iVar2) + local_48;
        }
      }
    }
  }
  if (local_44 != 0) {
    local_48 = local_48 - p->AreaInv;
  }
  if (pfNeedInv != (int *)0x0) {
    *pfNeedInv = local_44;
  }
  return local_48;
}

Assistant:

int Sfm_DecComputeFlipInvGain( Sfm_Dec_t * p, Abc_Obj_t * pPivot, int * pfNeedInv )
{
    Abc_Obj_t * pFanout; 
    Mio_Gate_t * pGate, * pGateNew;
    int i, Handle, fNeedInv = 0, Gain = 0;
    Abc_ObjForEachFanout( pPivot, pFanout, i )
    {
        if ( !Abc_ObjIsNode(pFanout) )
        {
            fNeedInv = 1;
            continue;
        }
        pGate = (Mio_Gate_t*)pFanout->pData;
        if ( Abc_ObjFaninNum(pFanout) == 1 && Mio_GateIsInv(pGate) )
        {
            Gain += p->AreaInv;
            continue;
        }
        Handle = Sfm_LibFindComplInputGate( &p->vGateFuncs, Mio_GateReadValue(pGate), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL );
        if ( Handle == -1 )
        {
            fNeedInv = 1;
            continue;
        }
        pGateNew = (Mio_Gate_t *)Vec_PtrEntry( &p->vGateHands, Handle );
        Gain += Scl_Flt2Int(Mio_GateReadArea(pGate)) - Scl_Flt2Int(Mio_GateReadArea(pGateNew));
    }
    if ( fNeedInv )
        Gain -= p->AreaInv;
    if ( pfNeedInv )
        *pfNeedInv = fNeedInv;
    return Gain;
}